

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O1

LightLeSample * __thiscall
pbrt::DistantLight::SampleLe
          (LightLeSample *__return_storage_ptr__,DistantLight *this,Point2f *u1,Point2f *u2,
          SampledWavelengths *lambda,Float time)

{
  undefined4 uVar1;
  undefined4 uVar3;
  undefined8 uVar2;
  bool bVar4;
  float fVar5;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  float fVar6;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  float fVar11;
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar17 [56];
  undefined1 auVar16 [64];
  float fVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar23 [56];
  undefined1 auVar22 [64];
  float fVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  float fVar28;
  undefined1 auVar29 [16];
  float fVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  SampledSpectrum SVar37;
  float local_b8;
  float fStack_b4;
  
  auVar13 = vinsertps_avx(*(undefined1 (*) [16])((this->super_LightBase).renderFromLight.m.m[0] + 1)
                          ,ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[1][1]),0x10);
  auVar8 = ZEXT816(0) << 0x40;
  auVar7._0_4_ = auVar13._0_4_ * 0.0;
  auVar7._4_4_ = auVar13._4_4_ * 0.0;
  auVar7._8_4_ = auVar13._8_4_ * 0.0;
  auVar7._12_4_ = auVar13._12_4_ * 0.0;
  auVar13 = vinsertps_avx((undefined1  [16])(this->super_LightBase).renderFromLight.m.m[0],
                          ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[1][0]),0x10);
  auVar7 = vfmadd213ps_fma(auVar13,auVar8,auVar7);
  auVar13 = vinsertps_avx(*(undefined1 (*) [16])((this->super_LightBase).renderFromLight.m.m[0] + 2)
                          ,ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[1][2]),0x10);
  auVar25._0_4_ = auVar13._0_4_ + auVar7._0_4_;
  auVar25._4_4_ = auVar13._4_4_ + auVar7._4_4_;
  auVar25._8_4_ = auVar13._8_4_ + auVar7._8_4_;
  auVar25._12_4_ = auVar13._12_4_ + auVar7._12_4_;
  auVar13 = vfmadd231ss_fma(ZEXT416((uint)((this->super_LightBase).renderFromLight.m.m[2][1] * 0.0))
                            ,ZEXT816(0) << 0x40,
                            ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[2][0]));
  fVar24 = auVar13._0_4_ + (this->super_LightBase).renderFromLight.m.m[2][2];
  auVar13._0_4_ = auVar25._0_4_ * auVar25._0_4_;
  auVar13._4_4_ = auVar25._4_4_ * auVar25._4_4_;
  auVar13._8_4_ = auVar25._8_4_ * auVar25._8_4_;
  auVar13._12_4_ = auVar25._12_4_ * auVar25._12_4_;
  auVar13 = vmovshdup_avx(auVar13);
  auVar13 = vfmadd231ss_fma(auVar13,auVar25,auVar25);
  auVar13 = vfmadd231ss_fma(auVar13,ZEXT416((uint)fVar24),ZEXT416((uint)fVar24));
  if (auVar13._0_4_ < 0.0) {
    fVar11 = sqrtf(auVar13._0_4_);
    auVar8 = ZEXT816(0) << 0x40;
  }
  else {
    auVar13 = vsqrtss_avx(auVar13,auVar13);
    fVar11 = auVar13._0_4_;
  }
  fVar6 = (u1->super_Tuple2<pbrt::Point2,_float>).x;
  fVar12 = (u1->super_Tuple2<pbrt::Point2,_float>).y;
  auVar10._0_4_ = fVar6 + fVar6;
  auVar10._4_4_ = fVar12 + fVar12;
  auVar10._8_8_ = 0;
  auVar9._8_4_ = 0xbf800000;
  auVar9._0_8_ = 0xbf800000bf800000;
  auVar9._12_4_ = 0xbf800000;
  auVar7 = vaddps_avx512vl(auVar10,auVar9);
  auVar13 = vmovshdup_avx(auVar7);
  fVar12 = auVar7._0_4_;
  fVar6 = auVar13._0_4_;
  if ((((fVar12 != 0.0) || (NAN(fVar12))) || (fVar6 != 0.0)) || (NAN(fVar6))) {
    auVar8._8_4_ = 0x7fffffff;
    auVar8._0_8_ = 0x7fffffff7fffffff;
    auVar8._12_4_ = 0x7fffffff;
    auVar8 = vandps_avx512vl(auVar7,auVar8);
    auVar13 = vshufps_avx(auVar8,auVar8,0xf5);
    bVar4 = auVar13._0_4_ < auVar8._0_4_;
    auVar26._0_4_ = fVar12 / fVar6;
    auVar26._4_12_ = auVar7._4_12_;
    auVar13 = vfmadd213ss_fma(SUB6416(ZEXT464(0xbf490fdb),0),auVar26,ZEXT416(0x3fc90fdb));
    fVar5 = (float)((uint)bVar4 * (int)((fVar6 / fVar12) * 0.7853982) + (uint)!bVar4 * auVar13._0_4_
                   );
    fVar6 = (float)((uint)bVar4 * (int)fVar12 + (uint)!bVar4 * (int)fVar6);
    fVar12 = cosf(fVar5);
    fVar5 = sinf(fVar5);
    auVar8 = vinsertps_avx(ZEXT416((uint)(fVar6 * fVar12)),ZEXT416((uint)(fVar6 * fVar5)),0x10);
  }
  fVar6 = this->scale;
  auVar14._4_4_ = fVar11;
  auVar14._0_4_ = fVar11;
  auVar14._8_4_ = fVar11;
  auVar14._12_4_ = fVar11;
  auVar13 = vdivps_avx(auVar25,auVar14);
  auVar15._8_4_ = 0x80000000;
  auVar15._0_8_ = 0x8000000080000000;
  auVar15._12_4_ = 0x80000000;
  fVar33 = auVar13._0_4_;
  fVar34 = auVar13._4_4_;
  auVar19._0_8_ = auVar13._0_8_ ^ 0x8000000080000000;
  fVar35 = auVar13._8_4_;
  auVar19._8_4_ = -fVar35;
  fVar36 = auVar13._12_4_;
  auVar19._12_4_ = -fVar36;
  auVar31._8_4_ = 0x3f800000;
  auVar31._0_8_ = 0x3f8000003f800000;
  auVar31._12_4_ = 0x3f800000;
  fVar24 = fVar24 / fVar11;
  auVar9 = vpternlogd_avx512vl(auVar31,ZEXT416((uint)fVar24),auVar15,0xf8);
  fVar30 = auVar9._0_4_;
  fVar18 = -1.0 / (fVar24 + fVar30);
  auVar7 = vmovshdup_avx(auVar13);
  fVar11 = this->sceneRadius;
  uVar1 = (this->sceneCenter).super_Tuple3<pbrt::Point3,_float>.x;
  uVar3 = (this->sceneCenter).super_Tuple3<pbrt::Point3,_float>.y;
  fVar28 = auVar8._0_4_;
  auVar20._0_4_ = fVar33 * fVar28;
  auVar20._4_4_ = fVar34 * auVar8._4_4_;
  auVar20._8_4_ = fVar35 * auVar8._8_4_;
  auVar20._12_4_ = fVar36 * auVar8._12_4_;
  auVar25 = vmovshdup_avx(auVar20);
  auVar23 = (undefined1  [56])0x0;
  fVar12 = (this->sceneCenter).super_Tuple3<pbrt::Point3,_float>.z;
  auVar17 = (undefined1  [56])0x0;
  SVar37 = DenselySampledSpectrum::Sample(&this->Lemit,lambda);
  auVar22._0_8_ = SVar37.values.values._8_8_;
  auVar22._8_56_ = auVar23;
  auVar16._0_8_ = SVar37.values.values._0_8_;
  auVar16._8_56_ = auVar17;
  auVar13 = vmovlhps_avx(auVar16._0_16_,auVar22._0_16_);
  fVar5 = fVar18 * fVar33 * auVar7._0_4_;
  auVar10 = vpermi2ps_avx512vl(_DAT_028da350,ZEXT416((uint)(fVar30 * fVar5)),ZEXT416((uint)fVar5));
  auVar7 = vshufps_avx(auVar8,auVar8,0xe1);
  auVar27._0_4_ = fVar33 * fVar33 * fVar30;
  auVar27._4_4_ = fVar34 * 0.0;
  auVar27._8_4_ = fVar35 * 0.0;
  auVar27._12_4_ = fVar36 * 0.0;
  auVar29._4_4_ = fVar18;
  auVar29._0_4_ = fVar18;
  auVar29._8_4_ = fVar18;
  auVar29._12_4_ = fVar18;
  auVar32._8_4_ = 0x3f800000;
  auVar32._0_8_ = 0x3f8000003f800000;
  auVar32._12_4_ = 0x3f800000;
  auVar9 = vunpcklps_avx(auVar32,auVar9);
  auVar9 = vfmadd231ps_fma(auVar9,auVar27,auVar29);
  auVar21._0_4_ =
       fVar33 * fVar11 +
       fVar11 * (fVar33 * 0.0 + auVar10._0_4_ * auVar7._0_4_ + fVar28 * auVar9._0_4_) + (float)uVar1
  ;
  auVar21._4_4_ =
       fVar34 * fVar11 +
       fVar11 * (fVar34 * 0.0 + auVar10._4_4_ * auVar7._4_4_ + auVar8._4_4_ * auVar9._4_4_) +
       (float)uVar3;
  auVar21._8_4_ =
       fVar35 * fVar11 +
       fVar11 * (fVar35 * 0.0 + auVar10._8_4_ * auVar7._8_4_ + auVar8._8_4_ * auVar9._8_4_) + 0.0;
  auVar21._12_4_ =
       fVar36 * fVar11 +
       fVar11 * (fVar36 * 0.0 + auVar10._12_4_ * auVar7._12_4_ + auVar8._12_4_ * auVar9._12_4_) +
       0.0;
  fVar5 = this->sceneRadius;
  (__return_storage_ptr__->L).values.values[0] = auVar13._0_4_ * fVar6;
  (__return_storage_ptr__->L).values.values[1] = auVar13._4_4_ * fVar6;
  (__return_storage_ptr__->L).values.values[2] = auVar13._8_4_ * fVar6;
  (__return_storage_ptr__->L).values.values[3] = auVar13._12_4_ * fVar6;
  uVar2 = vmovlps_avx(auVar21);
  (__return_storage_ptr__->ray).o.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar2;
  (__return_storage_ptr__->ray).o.super_Tuple3<pbrt::Point3,_float>.y =
       (float)(int)((ulong)uVar2 >> 0x20);
  (__return_storage_ptr__->ray).o.super_Tuple3<pbrt::Point3,_float>.z =
       fVar11 * fVar24 +
       fVar11 * (fVar24 * 0.0 + (fVar33 * -fVar30 * fVar28 - auVar25._0_4_)) + fVar12;
  uVar2 = vmovlps_avx(auVar19);
  (__return_storage_ptr__->ray).d.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar2;
  (__return_storage_ptr__->ray).d.super_Tuple3<pbrt::Vector3,_float>.y =
       (float)(int)((ulong)uVar2 >> 0x20);
  (__return_storage_ptr__->ray).d.super_Tuple3<pbrt::Vector3,_float>.z = -fVar24;
  (__return_storage_ptr__->ray).time = time;
  (__return_storage_ptr__->ray).medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = 0;
  (__return_storage_ptr__->intr).set = false;
  __return_storage_ptr__->pdfPos = 1.0 / (fVar5 * fVar5 * 3.1415927);
  __return_storage_ptr__->pdfDir = 1.0;
  return __return_storage_ptr__;
}

Assistant:

LightLeSample DistantLight::SampleLe(const Point2f &u1, const Point2f &u2,
                                     SampledWavelengths &lambda, Float time) const {
    // Choose point on disk oriented toward infinite light direction
    Vector3f w = Normalize(renderFromLight(Vector3f(0, 0, 1)));
    Frame wFrame = Frame::FromZ(w);
    Point2f cd = SampleUniformDiskConcentric(u1);
    Point3f pDisk = sceneCenter + sceneRadius * wFrame.FromLocal(Vector3f(cd.x, cd.y, 0));

    // Compute _DistantLight_ light ray
    Ray ray(pDisk + sceneRadius * w, -w, time);

    return LightLeSample(scale * Lemit.Sample(lambda), ray,
                         1 / (Pi * sceneRadius * sceneRadius), 1);
}